

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPoint2PointConstraint.cpp
# Opt level: O1

void __thiscall
btPoint2PointConstraint::btPoint2PointConstraint
          (btPoint2PointConstraint *this,btRigidBody *rbA,btVector3 *pivotInA)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  
  btTypedConstraint::btTypedConstraint
            (&this->super_btTypedConstraint,POINT2POINT_CONSTRAINT_TYPE,rbA);
  (this->super_btTypedConstraint)._vptr_btTypedConstraint =
       (_func_int **)&PTR__btTypedConstraint_002283c0;
  uVar4 = *(undefined8 *)(pivotInA->m_floats + 2);
  *(undefined8 *)(this->m_pivotInA).m_floats = *(undefined8 *)pivotInA->m_floats;
  *(undefined8 *)((this->m_pivotInA).m_floats + 2) = uVar4;
  fVar1 = pivotInA->m_floats[0];
  fVar2 = pivotInA->m_floats[1];
  fVar3 = pivotInA->m_floats[2];
  uVar4 = *(undefined8 *)(rbA->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
  auVar5._4_4_ = (float)((ulong)uVar4 >> 0x20) +
                 (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2] * fVar3
                 + (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0] *
                   fVar1 + (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
                           [1] * fVar2;
  auVar5._0_4_ = (float)uVar4 +
                 (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2] * fVar3
                 + (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0] *
                   fVar1 + (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
                           [1] * fVar2;
  auVar5._8_4_ = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2] * fVar3
                 + (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0] *
                   fVar1 + (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
                           [1] * fVar2 +
                 (rbA->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
  auVar5._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_pivotInB).m_floats = auVar5;
  this->m_flags = 0;
  this->m_useSolveConstraintObsolete = false;
  (this->m_setting).m_tau = 0.3;
  (this->m_setting).m_damping = 1.0;
  (this->m_setting).m_impulseClamp = 0.0;
  return;
}

Assistant:

btPoint2PointConstraint::btPoint2PointConstraint(btRigidBody& rbA,const btVector3& pivotInA)
:btTypedConstraint(POINT2POINT_CONSTRAINT_TYPE,rbA),m_pivotInA(pivotInA),m_pivotInB(rbA.getCenterOfMassTransform()(pivotInA)),
m_flags(0),
m_useSolveConstraintObsolete(false)
{
	
}